

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O1

ion_err_t flat_file_binary_search
                    (ion_flat_file_t *flat_file,ion_key_t target_key,ion_fpos_t *location)

{
  bool bVar1;
  ion_err_t iVar2;
  char cVar3;
  ion_err_t unaff_BL;
  long lVar4;
  long location_00;
  long lVar5;
  long lVar6;
  ion_flat_file_row_t row;
  ion_flat_file_row_t local_48;
  
  if (flat_file->sorted_mode == '\0') {
    unaff_BL = '\x14';
  }
  else {
    lVar4 = (ulong)(flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size - 1;
    if (lVar4 < 0) {
      *location = -1;
      unaff_BL = '\x01';
    }
    else {
      lVar5 = 0;
      do {
        if (lVar4 - lVar5 == 0 || lVar4 < lVar5) {
          iVar2 = flat_file_read_row(flat_file,lVar5,&local_48);
          if (iVar2 != '\0') {
            return iVar2;
          }
          cVar3 = (*(flat_file->super).compare)
                            (local_48.key,target_key,(flat_file->super).record.key_size);
          lVar5 = lVar5 - (ulong)('\0' < cVar3);
          *location = lVar5;
          return (byte)((ulong)lVar5 >> 0x3f);
        }
        location_00 = (lVar4 - lVar5) / 2 + lVar5;
        iVar2 = flat_file_read_row(flat_file,location_00,&local_48);
        if (iVar2 != '\0') {
          return iVar2;
        }
        cVar3 = (*(flat_file->super).compare)
                          (target_key,local_48.key,(flat_file->super).record.key_size);
        if (cVar3 < '\x01') {
          if (cVar3 < '\0') {
            lVar4 = location_00 + -1;
            bVar1 = true;
          }
          else {
            do {
              lVar6 = location_00;
              unaff_BL = flat_file_read_row(flat_file,lVar6 + -1,&local_48);
              if (unaff_BL != '\0') goto LAB_001079f8;
            } while ((0 < lVar6) &&
                    (cVar3 = (*(flat_file->super).compare)
                                       (local_48.key,target_key,(flat_file->super).record.key_size),
                    location_00 = lVar6 + -1, cVar3 == '\0'));
            *location = lVar6;
            unaff_BL = '\0';
LAB_001079f8:
            bVar1 = false;
          }
        }
        else {
          lVar5 = location_00 + 1;
          bVar1 = true;
        }
      } while (bVar1);
    }
  }
  return unaff_BL;
}

Assistant:

ion_err_t
flat_file_binary_search(
	ion_flat_file_t *flat_file,
	ion_key_t		target_key,
	ion_fpos_t		*location
) {
	if (!flat_file->sorted_mode) {
		return err_sorted_order_violation;
	}

	ion_err_t			err;
	ion_flat_file_row_t row;
	ion_fpos_t			low_idx		= 0;
	ion_fpos_t			high_idx	= (flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size - 1;
	ion_fpos_t			mid_idx;

	if (high_idx < 0) {
		/* We're empty, short circuit */
		*location = -1;
		return err_item_not_found;
	}

	while (low_idx < high_idx) {
		mid_idx = low_idx + (high_idx - low_idx) / 2;
		err		= flat_file_read_row(flat_file, mid_idx, &row);

		if (err_ok != err) {
			return err;
		}

		char comp_result = flat_file->super.compare(target_key, row.key, flat_file->super.record.key_size);

		if (comp_result > 0) {
			low_idx = mid_idx + 1;
		}
		else if (comp_result < 0) {
			high_idx = mid_idx - 1;
		}
		else {
			/* Match found, scroll to beginning of (potential) duplicate block and return */
			ion_fpos_t	last_dup_idx;
			ion_fpos_t	dup_idx = mid_idx;

			do {
				last_dup_idx	= dup_idx;
				dup_idx--;
				err				= flat_file_read_row(flat_file, dup_idx, &row);

				if (err_ok != err) {
					return err;
				}
			} while (dup_idx >= 0 && 0 == flat_file->super.compare(row.key, target_key, flat_file->super.record.key_size));

			*location = last_dup_idx;
			return err_ok;
		}
	}

	/* If we reach here, then we fell through the loop - do check and adjust for LEQ as necessary */
	err = flat_file_read_row(flat_file, low_idx, &row);

	if (err_ok != err) {
		return err;
	}

	if (flat_file->super.compare(row.key, target_key, flat_file->super.record.key_size) > 0) {
		low_idx--;
	}

	*location = low_idx;
	return low_idx >= 0 ? err_ok : err_item_not_found;
}